

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.hpp
# Opt level: O1

void __thiscall
duckdb::ArrowExtensionMetadata::ArrowExtensionMetadata
          (ArrowExtensionMetadata *this,ArrowExtensionMetadata *param_1)

{
  pointer pcVar1;
  
  (this->extension_name)._M_dataplus._M_p = (pointer)&(this->extension_name).field_2;
  pcVar1 = (param_1->extension_name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->extension_name)._M_string_length);
  (this->vendor_name)._M_dataplus._M_p = (pointer)&(this->vendor_name).field_2;
  pcVar1 = (param_1->vendor_name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->vendor_name,pcVar1,pcVar1 + (param_1->vendor_name)._M_string_length);
  (this->type_name)._M_dataplus._M_p = (pointer)&(this->type_name).field_2;
  pcVar1 = (param_1->type_name)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->type_name,pcVar1,pcVar1 + (param_1->type_name)._M_string_length);
  (this->arrow_format)._M_dataplus._M_p = (pointer)&(this->arrow_format).field_2;
  pcVar1 = (param_1->arrow_format)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->arrow_format,pcVar1,pcVar1 + (param_1->arrow_format)._M_string_length)
  ;
  return;
}

Assistant:

ArrowExtensionMetadata() {
	}